

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O2

void duckdb::StringDecompressFunction<unsigned_long>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  long lVar5;
  void *dataptr;
  string_t *psVar6;
  optional_idx oVar7;
  FunctionLocalState *pFVar8;
  reference vector;
  idx_t iVar9;
  Vector *vector_00;
  ValidityMask *pVVar10;
  SelectionVector *sel;
  void *in_RCX;
  idx_t extraout_RDX;
  idx_t idx;
  ValidityMask *pVVar11;
  ValidityMask *mask;
  ValidityMask *pVVar12;
  void *in_R9;
  data_ptr_t pdVar13;
  idx_t *piVar14;
  string_t sVar15;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  undefined1 in_stack_ffffffffffffff78;
  optional_idx dict_size;
  data_ptr_t local_70;
  unsigned_long *local_68;
  
  dict_size.index = (idx_t)state[1]._vptr_ExpressionState;
  pFVar8 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&dict_size);
  ArenaAllocator::Reset((ArenaAllocator *)(pFVar8 + 1));
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  pVVar12 = (ValidityMask *)args->count;
  VVar1 = vector->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar6 = (string_t *)result->data;
    puVar3 = (unsigned_long *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
              (puVar3,psVar6,(idx_t)pVVar12,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff78);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(vector);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar9 = optional_idx::GetIndex(&dict_size), (ValidityMask *)(iVar9 * 2) <= pVVar12)) &&
         (vector_00 = DictionaryVector::Child(vector), vector_00->vector_type == FLAT_VECTOR)) {
        psVar6 = (string_t *)result->data;
        puVar3 = (unsigned_long *)vector_00->data;
        iVar9 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
                  (puVar3,psVar6,iVar9,&vector_00->validity,&result->validity,in_R9,
                   (bool)in_stack_ffffffffffffff78);
        sel = DictionaryVector::SelVector(vector);
        iVar9 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar9,sel,(idx_t)pVVar12);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
      puVar3 = (unsigned_long *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      pVVar12 = (ValidityMask *)0x0;
      ConstantVector::SetNull(result,false);
      aVar16 = (anon_struct_16_3_d7536bce_for_pointer)
               UnaryLambdaWrapper::
               Operation<duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_,unsigned_long,duckdb::string_t>
                         (*puVar3,pVVar12,idx,in_RCX);
      paVar2->pointer = aVar16;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(vector,(idx_t)pVVar12,(UnifiedVectorFormat *)&dict_size);
    mask = (ValidityMask *)0x0;
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar7 = dict_size;
    pdVar13 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      piVar14 = (idx_t *)(pdVar13 + 8);
      iVar9 = extraout_RDX;
      for (pVVar11 = (ValidityMask *)0x0; pVVar12 != pVVar11;
          pVVar11 = (ValidityMask *)
                    ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
          ) {
        dataptr = *(void **)oVar7.index;
        pVVar10 = pVVar11;
        if (dataptr != (void *)0x0) {
          pVVar10 = (ValidityMask *)(ulong)*(uint *)((long)dataptr + (long)pVVar11 * 4);
        }
        sVar15 = UnaryLambdaWrapper::
                 Operation<duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_,unsigned_long,duckdb::string_t>
                           (*(unsigned_long *)(local_70 + (long)pVVar10 * 8),mask,iVar9,dataptr);
        iVar9 = sVar15.value._8_8_;
        piVar14[-1] = sVar15.value._0_8_;
        *piVar14 = iVar9;
        piVar14 = piVar14 + 2;
      }
    }
    else {
      pdVar13 = pdVar13 + 8;
      for (pVVar11 = (ValidityMask *)0x0; pVVar12 != pVVar11;
          pVVar11 = (ValidityMask *)
                    ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
          ) {
        lVar5 = *(long *)oVar7.index;
        pVVar10 = pVVar11;
        if (lVar5 != 0) {
          pVVar10 = (ValidityMask *)(ulong)*(uint *)(lVar5 + (long)pVVar11 * 4);
        }
        if (((ulong)local_68[(ulong)pVVar10 >> 6] >> ((ulong)pVVar10 & 0x3f) & 1) == 0) {
          mask = pVVar11;
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar11);
        }
        else {
          sVar15 = UnaryLambdaWrapper::
                   Operation<duckdb::StringDecompressFunction<unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_,unsigned_long,duckdb::string_t>
                             (*(unsigned_long *)(local_70 + (long)pVVar10 * 8),mask,
                              (ulong)pVVar10 >> 6,(void *)local_68[(ulong)pVVar10 >> 6]);
          *(long *)(pdVar13 + -8) = sVar15.value._0_8_;
          *(long *)pdVar13 = sVar15.value._8_8_;
        }
        pdVar13 = pdVar13 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}